

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersector1<8,_1048576,_false,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMiIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float fVar1;
  undefined8 *puVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  Scene *pSVar6;
  float **ppfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  Geometry *pGVar12;
  RTCIntersectArguments *pRVar13;
  RTCRayQueryContext *pRVar14;
  bool bVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  uint uVar19;
  undefined1 auVar20 [16];
  byte bVar21;
  int iVar22;
  ulong *puVar23;
  long lVar24;
  ulong uVar25;
  uint uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong *puVar30;
  ulong uVar31;
  ulong unaff_R13;
  size_t mask;
  ulong uVar32;
  ulong uVar33;
  uint uVar34;
  ulong uVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  float fVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [64];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  undefined4 uVar74;
  undefined1 auVar75 [32];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [64];
  undefined1 auVar86 [16];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 in_ZMM13 [64];
  undefined1 auVar90 [16];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  UVIdentity<4> mapUV;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2619;
  ulong local_2618;
  ulong local_2610;
  RayHit *local_2608;
  RayQueryContext *local_2600;
  float local_25f8;
  int local_25f4;
  ulong *local_25f0;
  ulong local_25e8;
  ulong local_25e0;
  ulong local_25d8;
  ulong local_25d0;
  ulong local_25c8;
  ulong local_25c0;
  long local_25b8;
  long local_25b0;
  RTCFilterFunctionNArguments local_25a8;
  float local_2578;
  float local_2574;
  float local_2570;
  undefined4 local_256c;
  undefined4 local_2568;
  undefined4 local_2564;
  uint local_2560;
  uint local_255c;
  uint local_2558;
  undefined1 local_2548 [16];
  undefined8 local_2538;
  undefined8 uStack_2530;
  undefined1 local_2528 [32];
  undefined1 local_2508 [32];
  undefined1 local_24e8 [32];
  undefined1 local_24c8 [32];
  undefined1 local_24a8 [32];
  undefined1 local_2488 [16];
  undefined1 local_2478 [16];
  undefined1 local_2468 [16];
  undefined1 *local_2458;
  byte local_2450;
  undefined1 local_2448 [16];
  undefined1 local_2438 [16];
  undefined1 local_2428 [16];
  undefined1 local_2418 [16];
  undefined1 local_2408 [16];
  float local_23f8 [4];
  undefined8 local_23e8;
  undefined8 uStack_23e0;
  undefined1 local_23d8 [32];
  undefined1 local_23b8 [32];
  undefined1 local_2398 [32];
  ulong local_2378;
  undefined4 local_2370 [2];
  ulong local_2368 [1127];
  float fVar2;
  float fVar3;
  undefined1 auVar62 [32];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_2378 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
    local_2370[0] = 0;
    if (local_2378 != 8) {
      aVar5 = (ray->super_RayK<1>).dir.field_0.field_1;
      puVar30 = local_2368;
      auVar56 = vmaxss_avx(ZEXT816(0) << 0x40,
                           ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar57 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      auVar36._8_4_ = 0x7fffffff;
      auVar36._0_8_ = 0x7fffffff7fffffff;
      auVar36._12_4_ = 0x7fffffff;
      auVar36 = vandps_avx512vl((undefined1  [16])aVar5,auVar36);
      auVar37 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      auVar91 = ZEXT1664(auVar37);
      uVar28 = vcmpps_avx512vl(auVar36,auVar37,1);
      bVar15 = (bool)((byte)uVar28 & 1);
      auVar52._0_4_ = (uint)bVar15 * auVar37._0_4_ | (uint)!bVar15 * (int)aVar5.x;
      bVar15 = (bool)((byte)(uVar28 >> 1) & 1);
      auVar52._4_4_ = (uint)bVar15 * auVar37._4_4_ | (uint)!bVar15 * (int)aVar5.y;
      bVar15 = (bool)((byte)(uVar28 >> 2) & 1);
      auVar52._8_4_ = (uint)bVar15 * auVar37._8_4_ | (uint)!bVar15 * (int)aVar5.z;
      bVar15 = (bool)((byte)(uVar28 >> 3) & 1);
      auVar52._12_4_ = (uint)bVar15 * auVar37._12_4_ | (uint)!bVar15 * aVar5.field_3.a;
      auVar36 = vrcp14ps_avx512vl(auVar52);
      auVar37._8_4_ = 0x3f800000;
      auVar37._0_8_ = &DAT_3f8000003f800000;
      auVar37._12_4_ = 0x3f800000;
      auVar37 = vfnmadd213ps_avx512vl(auVar52,auVar36,auVar37);
      auVar52 = vfmadd132ps_fma(auVar37,auVar36,auVar36);
      local_24a8 = vbroadcastss_avx512vl(auVar52);
      auVar92 = ZEXT3264(local_24a8);
      auVar36 = vmovshdup_avx(auVar52);
      local_24c8 = vbroadcastsd_avx512vl(auVar36);
      auVar93 = ZEXT3264(local_24c8);
      auVar62._8_4_ = 2;
      auVar62._0_8_ = 0x200000002;
      auVar62._12_4_ = 2;
      auVar62._16_4_ = 2;
      auVar62._20_4_ = 2;
      auVar62._24_4_ = 2;
      auVar62._28_4_ = 2;
      auVar37 = vshufpd_avx(auVar52,auVar52,1);
      local_24e8 = vpermps_avx512vl(auVar62,ZEXT1632(auVar52));
      auVar94 = ZEXT3264(local_24e8);
      fVar68 = auVar52._0_4_ * (ray->super_RayK<1>).org.field_0.m128[0];
      auVar59._8_4_ = 1;
      auVar59._0_8_ = 0x100000001;
      auVar59._12_4_ = 1;
      auVar59._16_4_ = 1;
      auVar59._20_4_ = 1;
      auVar59._24_4_ = 1;
      auVar59._28_4_ = 1;
      auVar82._4_4_ = fVar68;
      auVar82._0_4_ = fVar68;
      auVar82._8_4_ = fVar68;
      auVar82._12_4_ = fVar68;
      auVar82._16_4_ = fVar68;
      auVar82._20_4_ = fVar68;
      auVar82._24_4_ = fVar68;
      auVar82._28_4_ = fVar68;
      auVar60 = ZEXT1632(CONCAT412(auVar52._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3],
                                   CONCAT48(auVar52._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2]
                                            ,CONCAT44(auVar52._4_4_ *
                                                      (ray->super_RayK<1>).org.field_0.m128[1],
                                                      fVar68))));
      auVar59 = vpermps_avx2(auVar59,auVar60);
      auVar60 = vpermps_avx2(auVar62,auVar60);
      uVar74 = auVar57._0_4_;
      auVar71 = ZEXT3264(CONCAT428(uVar74,CONCAT424(uVar74,CONCAT420(uVar74,CONCAT416(uVar74,
                                                  CONCAT412(uVar74,CONCAT48(uVar74,CONCAT44(uVar74,
                                                  uVar74))))))));
      uVar31 = (ulong)(auVar52._0_4_ < 0.0) << 3;
      local_25d0 = (ulong)((uint)(auVar36._0_4_ < 0.0) * 8 + 0x10);
      local_25e0 = (ulong)((uint)(auVar37._0_4_ < 0.0) * 8 + 0x20);
      auVar61._8_4_ = 0x80000000;
      auVar61._0_8_ = 0x8000000080000000;
      auVar61._12_4_ = 0x80000000;
      auVar61._16_4_ = 0x80000000;
      auVar61._20_4_ = 0x80000000;
      auVar61._24_4_ = 0x80000000;
      auVar61._28_4_ = 0x80000000;
      local_2508 = vxorps_avx512vl(auVar82,auVar61);
      auVar95 = ZEXT3264(local_2508);
      local_2528 = vxorps_avx512vl(auVar59,auVar61);
      auVar96 = ZEXT3264(local_2528);
      local_23b8._0_8_ = auVar60._0_8_ ^ 0x8000000080000000;
      local_23b8._8_4_ = auVar60._8_4_ ^ 0x80000000;
      local_23b8._12_4_ = auVar60._12_4_ ^ 0x80000000;
      local_23b8._16_4_ = auVar60._16_4_ ^ 0x80000000;
      local_23b8._20_4_ = auVar60._20_4_ ^ 0x80000000;
      local_23b8._24_4_ = auVar60._24_4_ ^ 0x80000000;
      local_23b8._28_4_ = auVar60._28_4_ ^ 0x80000000;
      auVar85 = ZEXT3264(local_23b8);
      uVar74 = auVar56._0_4_;
      local_23d8._4_4_ = uVar74;
      local_23d8._0_4_ = uVar74;
      local_23d8._8_4_ = uVar74;
      local_23d8._12_4_ = uVar74;
      local_23d8._16_4_ = uVar74;
      local_23d8._20_4_ = uVar74;
      local_23d8._24_4_ = uVar74;
      local_23d8._28_4_ = uVar74;
      auVar87 = ZEXT3264(local_23d8);
      auVar59 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
      auVar88 = ZEXT3264(auVar59);
      auVar89 = ZEXT3264(CONCAT428(0xfffffff8,
                                   CONCAT424(0xfffffff8,
                                             CONCAT420(0xfffffff8,
                                                       CONCAT416(0xfffffff8,
                                                                 CONCAT412(0xfffffff8,
                                                                           CONCAT48(0xfffffff8,
                                                                                                                                                                        
                                                  0xfffffff8fffffff8)))))));
      local_25c8 = uVar31 ^ 8;
      local_25d8 = local_25d0 ^ 8;
      local_25e8 = local_25e0 ^ 8;
      uVar28 = local_25d0 ^ 8;
      uVar25 = uVar31 ^ 8;
      uVar29 = local_25d0;
      uVar32 = local_25e0;
      uVar33 = local_25e0 ^ 8;
      local_2610 = uVar31;
      local_2608 = ray;
      local_2600 = context;
      do {
        do {
          do {
            if (puVar30 == &local_2378) {
              return;
            }
            pfVar8 = (float *)(puVar30 + -1);
            puVar30 = puVar30 + -2;
          } while ((ray->super_RayK<1>).tfar < *pfVar8);
          local_2618 = *puVar30;
          do {
            if ((local_2618 & 8) == 0) {
              puVar23 = (ulong *)((local_2618 & 0xfffffffffffffff0) + 0x40);
              if ((local_2618 & 0xfffffffffffffff0) == 0) {
                puVar23 = (ulong *)0x0;
              }
              auVar41._8_8_ = 0;
              auVar41._0_8_ = *puVar23;
              auVar44._8_8_ = 0;
              auVar44._0_8_ = puVar23[1];
              uVar17 = vpcmpub_avx512vl(auVar41,auVar44,2);
              uVar74 = (undefined4)puVar23[6];
              auVar60._4_4_ = uVar74;
              auVar60._0_4_ = uVar74;
              auVar60._8_4_ = uVar74;
              auVar60._12_4_ = uVar74;
              auVar60._16_4_ = uVar74;
              auVar60._20_4_ = uVar74;
              auVar60._24_4_ = uVar74;
              auVar60._28_4_ = uVar74;
              uVar74 = *(undefined4 *)((long)puVar23 + 0x3c);
              auVar65._4_4_ = uVar74;
              auVar65._0_4_ = uVar74;
              auVar65._8_4_ = uVar74;
              auVar65._12_4_ = uVar74;
              auVar65._16_4_ = uVar74;
              auVar65._20_4_ = uVar74;
              auVar65._24_4_ = uVar74;
              auVar65._28_4_ = uVar74;
              auVar56._8_8_ = 0;
              auVar56._0_8_ = *(ulong *)((long)puVar23 + uVar31);
              auVar59 = vpmovzxbd_avx2(auVar56);
              auVar59 = vcvtdq2ps_avx(auVar59);
              auVar56 = vfmadd213ps_fma(auVar59,auVar65,auVar60);
              auVar57._8_8_ = 0;
              auVar57._0_8_ = *(ulong *)((long)puVar23 + uVar25);
              auVar59 = vpmovzxbd_avx2(auVar57);
              auVar59 = vcvtdq2ps_avx(auVar59);
              auVar57 = vfmadd213ps_fma(auVar59,auVar65,auVar60);
              uVar74 = *(undefined4 *)((long)puVar23 + 0x34);
              auVar66._4_4_ = uVar74;
              auVar66._0_4_ = uVar74;
              auVar66._8_4_ = uVar74;
              auVar66._12_4_ = uVar74;
              auVar66._16_4_ = uVar74;
              auVar66._20_4_ = uVar74;
              auVar66._24_4_ = uVar74;
              auVar66._28_4_ = uVar74;
              uVar74 = (undefined4)puVar23[8];
              auVar64._4_4_ = uVar74;
              auVar64._0_4_ = uVar74;
              auVar64._8_4_ = uVar74;
              auVar64._12_4_ = uVar74;
              auVar64._16_4_ = uVar74;
              auVar64._20_4_ = uVar74;
              auVar64._24_4_ = uVar74;
              auVar64._28_4_ = uVar74;
              auVar39._8_8_ = 0;
              auVar39._0_8_ = *(ulong *)((long)puVar23 + uVar29);
              auVar59 = vpmovzxbd_avx2(auVar39);
              auVar59 = vcvtdq2ps_avx(auVar59);
              auVar36 = vfmadd213ps_fma(auVar59,auVar64,auVar66);
              auVar38._8_8_ = 0;
              auVar38._0_8_ = *(ulong *)((long)puVar23 + uVar28);
              auVar59 = vpmovzxbd_avx2(auVar38);
              auVar59 = vcvtdq2ps_avx(auVar59);
              auVar37 = vfmadd213ps_fma(auVar59,auVar64,auVar66);
              uVar74 = (undefined4)puVar23[7];
              auVar73._4_4_ = uVar74;
              auVar73._0_4_ = uVar74;
              auVar73._8_4_ = uVar74;
              auVar73._12_4_ = uVar74;
              auVar73._16_4_ = uVar74;
              auVar73._20_4_ = uVar74;
              auVar73._24_4_ = uVar74;
              auVar73._28_4_ = uVar74;
              uVar74 = *(undefined4 *)((long)puVar23 + 0x44);
              auVar75._4_4_ = uVar74;
              auVar75._0_4_ = uVar74;
              auVar75._8_4_ = uVar74;
              auVar75._12_4_ = uVar74;
              auVar75._16_4_ = uVar74;
              auVar75._20_4_ = uVar74;
              auVar75._24_4_ = uVar74;
              auVar75._28_4_ = uVar74;
              auVar42._8_8_ = 0;
              auVar42._0_8_ = *(ulong *)((long)puVar23 + uVar32);
              auVar59 = vpmovzxbd_avx2(auVar42);
              auVar59 = vcvtdq2ps_avx(auVar59);
              auVar52 = vfmadd213ps_fma(auVar59,auVar75,auVar73);
              auVar40._8_8_ = 0;
              auVar40._0_8_ = *(ulong *)((long)puVar23 + uVar33);
              auVar59 = vpmovzxbd_avx2(auVar40);
              auVar59 = vcvtdq2ps_avx(auVar59);
              auVar39 = vfmadd213ps_fma(auVar59,auVar75,auVar73);
              auVar59 = vfmadd213ps_avx512vl(ZEXT1632(auVar56),auVar92._0_32_,auVar95._0_32_);
              auVar60 = vfmadd213ps_avx512vl(ZEXT1632(auVar36),auVar93._0_32_,auVar96._0_32_);
              auVar59 = vpmaxsd_avx2(auVar59,auVar60);
              auVar60 = vfmadd213ps_avx512vl(ZEXT1632(auVar52),auVar94._0_32_,auVar85._0_32_);
              auVar60 = vpmaxsd_avx2(auVar60,auVar87._0_32_);
              auVar59 = vpmaxsd_avx2(auVar59,auVar60);
              in_ZMM13 = ZEXT3264(auVar59);
              auVar60 = vfmadd213ps_avx512vl(ZEXT1632(auVar57),auVar92._0_32_,auVar95._0_32_);
              auVar61 = vfmadd213ps_avx512vl(ZEXT1632(auVar37),auVar93._0_32_,auVar96._0_32_);
              auVar60 = vpminsd_avx2(auVar60,auVar61);
              auVar61 = vfmadd213ps_avx512vl(ZEXT1632(auVar39),auVar94._0_32_,auVar85._0_32_);
              auVar61 = vpminsd_avx2(auVar61,auVar71._0_32_);
              auVar60 = vpminsd_avx2(auVar60,auVar61);
              uVar18 = vpcmpd_avx512vl(auVar59,auVar60,2);
              unaff_R13 = CONCAT44((int)(unaff_R13 >> 0x20),
                                   (uint)(byte)((byte)uVar17 & (byte)uVar18));
            }
            if ((local_2618 & 8) == 0) {
              if (unaff_R13 == 0) {
                iVar22 = 4;
              }
              else {
                auVar59 = *(undefined1 (*) [32])(local_2618 & 0xfffffffffffffff0);
                auVar60 = ((undefined1 (*) [32])(local_2618 & 0xfffffffffffffff0))[1];
                auVar82 = in_ZMM13._0_32_;
                auVar61 = vpternlogd_avx512vl(auVar88._0_32_,auVar82,auVar89._0_32_,0xf8);
                uVar35 = unaff_R13 & 0xffffffff;
                auVar62 = vpcompressd_avx512vl(auVar61);
                bVar15 = (bool)((byte)uVar35 & 1);
                auVar63._0_4_ = (uint)bVar15 * auVar62._0_4_ | (uint)!bVar15 * auVar61._0_4_;
                bVar15 = (bool)((byte)(uVar35 >> 1) & 1);
                auVar63._4_4_ = (uint)bVar15 * auVar62._4_4_ | (uint)!bVar15 * auVar61._4_4_;
                bVar15 = (bool)((byte)(uVar35 >> 2) & 1);
                auVar63._8_4_ = (uint)bVar15 * auVar62._8_4_ | (uint)!bVar15 * auVar61._8_4_;
                bVar15 = (bool)((byte)(uVar35 >> 3) & 1);
                auVar63._12_4_ = (uint)bVar15 * auVar62._12_4_ | (uint)!bVar15 * auVar61._12_4_;
                bVar15 = (bool)((byte)(uVar35 >> 4) & 1);
                auVar63._16_4_ = (uint)bVar15 * auVar62._16_4_ | (uint)!bVar15 * auVar61._16_4_;
                bVar15 = (bool)((byte)(uVar35 >> 5) & 1);
                auVar63._20_4_ = (uint)bVar15 * auVar62._20_4_ | (uint)!bVar15 * auVar61._20_4_;
                bVar15 = (bool)((byte)(uVar35 >> 6) & 1);
                auVar63._24_4_ = (uint)bVar15 * auVar62._24_4_ | (uint)!bVar15 * auVar61._24_4_;
                bVar15 = (bool)((byte)(uVar35 >> 7) & 1);
                auVar63._28_4_ = (uint)bVar15 * auVar62._28_4_ | (uint)!bVar15 * auVar61._28_4_;
                auVar61 = vpermt2q_avx512vl(auVar59,auVar63,auVar60);
                local_2618 = auVar61._0_8_;
                iVar22 = 0;
                uVar35 = unaff_R13 - 1 & unaff_R13;
                if (uVar35 != 0) {
                  auVar61 = vpshufd_avx2(auVar63,0x55);
                  vpermt2q_avx512vl(auVar59,auVar61,auVar60);
                  auVar62 = vpminsd_avx2(auVar63,auVar61);
                  auVar61 = vpmaxsd_avx2(auVar63,auVar61);
                  uVar35 = uVar35 - 1 & uVar35;
                  if (uVar35 == 0) {
                    auVar62 = vpermi2q_avx512vl(auVar62,auVar59,auVar60);
                    local_2618 = auVar62._0_8_;
                    auVar59 = vpermt2q_avx512vl(auVar59,auVar61,auVar60);
                    *puVar30 = auVar59._0_8_;
                    auVar59 = vpermd_avx2(auVar61,auVar82);
                    *(int *)(puVar30 + 1) = auVar59._0_4_;
                    puVar30 = puVar30 + 2;
                  }
                  else {
                    auVar73 = vpshufd_avx2(auVar63,0xaa);
                    vpermt2q_avx512vl(auVar59,auVar73,auVar60);
                    auVar66 = vpminsd_avx2(auVar62,auVar73);
                    auVar62 = vpmaxsd_avx2(auVar62,auVar73);
                    auVar73 = vpminsd_avx2(auVar61,auVar62);
                    auVar61 = vpmaxsd_avx2(auVar61,auVar62);
                    uVar35 = uVar35 - 1 & uVar35;
                    if (uVar35 == 0) {
                      auVar62 = vpermi2q_avx512vl(auVar66,auVar59,auVar60);
                      local_2618 = auVar62._0_8_;
                      auVar62 = vpermt2q_avx512vl(auVar59,auVar61,auVar60);
                      *puVar30 = auVar62._0_8_;
                      auVar61 = vpermd_avx2(auVar61,auVar82);
                      *(int *)(puVar30 + 1) = auVar61._0_4_;
                      auVar59 = vpermt2q_avx512vl(auVar59,auVar73,auVar60);
                      puVar30[2] = auVar59._0_8_;
                      auVar59 = vpermd_avx2(auVar73,auVar82);
                      *(int *)(puVar30 + 3) = auVar59._0_4_;
                      puVar30 = puVar30 + 4;
                    }
                    else {
                      auVar62 = vpshufd_avx2(auVar63,0xff);
                      vpermt2q_avx512vl(auVar59,auVar62,auVar60);
                      auVar65 = vpminsd_avx2(auVar66,auVar62);
                      auVar62 = vpmaxsd_avx2(auVar66,auVar62);
                      auVar66 = vpminsd_avx2(auVar73,auVar62);
                      auVar62 = vpmaxsd_avx2(auVar73,auVar62);
                      auVar73 = vpminsd_avx2(auVar61,auVar62);
                      auVar61 = vpmaxsd_avx2(auVar61,auVar62);
                      uVar35 = uVar35 - 1 & uVar35;
                      ray = local_2608;
                      context = local_2600;
                      uVar31 = local_2610;
                      iVar22 = 0;
                      if (uVar35 == 0) {
                        auVar62 = vpermi2q_avx512vl(auVar65,auVar59,auVar60);
                        local_2618 = auVar62._0_8_;
                        auVar62 = vpermt2q_avx512vl(auVar59,auVar61,auVar60);
                        *puVar30 = auVar62._0_8_;
                        in_ZMM13 = ZEXT3264(auVar82);
                        auVar61 = vpermd_avx2(auVar61,auVar82);
                        *(int *)(puVar30 + 1) = auVar61._0_4_;
                        auVar61 = vpermt2q_avx512vl(auVar59,auVar73,auVar60);
                        puVar30[2] = auVar61._0_8_;
                        auVar61 = vpermd_avx2(auVar73,auVar82);
                        *(int *)(puVar30 + 3) = auVar61._0_4_;
                        auVar59 = vpermt2q_avx512vl(auVar59,auVar66,auVar60);
                        puVar30[4] = auVar59._0_8_;
                        auVar59 = vpermd_avx2(auVar66,auVar82);
                        *(int *)(puVar30 + 5) = auVar59._0_4_;
                        puVar30 = puVar30 + 6;
                        auVar56 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
                        auVar91 = ZEXT1664(auVar56);
                        auVar92 = ZEXT3264(local_24a8);
                        auVar93 = ZEXT3264(local_24c8);
                        auVar94 = ZEXT3264(local_24e8);
                        auVar95 = ZEXT3264(local_2508);
                        auVar96 = ZEXT3264(local_2528);
                      }
                      else {
                        auVar64 = valignd_avx512vl(auVar63,auVar63,3);
                        auVar62 = vpmovsxbd_avx2(ZEXT816(0x303020108));
                        auVar65 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                       CONCAT48(0x80000000,
                                                                                0x8000000080000000))
                                                            ),auVar62,auVar65);
                        auVar62 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                        auVar66 = vpermt2d_avx512vl(auVar65,auVar62,auVar66);
                        auVar66 = vpermt2d_avx512vl(auVar66,auVar62,auVar73);
                        auVar62 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                        auVar61 = vpermt2d_avx512vl(auVar66,auVar62,auVar61);
                        auVar91 = ZEXT3264(auVar61);
                        uVar27 = uVar35;
                        do {
                          auVar62 = auVar91._0_32_;
                          auVar78._8_4_ = 1;
                          auVar78._0_8_ = 0x100000001;
                          auVar78._12_4_ = 1;
                          auVar78._16_4_ = 1;
                          auVar78._20_4_ = 1;
                          auVar78._24_4_ = 1;
                          auVar78._28_4_ = 1;
                          auVar61 = vpermd_avx2(auVar78,auVar64);
                          auVar64 = valignd_avx512vl(auVar64,auVar64,1);
                          vpermt2q_avx512vl(auVar59,auVar64,auVar60);
                          uVar27 = uVar27 - 1 & uVar27;
                          uVar17 = vpcmpd_avx512vl(auVar61,auVar62,5);
                          auVar61 = vpmaxsd_avx2(auVar61,auVar62);
                          bVar21 = (byte)uVar17 << 1;
                          auVar62 = valignd_avx512vl(auVar62,auVar62,7);
                          bVar15 = (bool)((byte)uVar17 & 1);
                          auVar67._4_4_ =
                               (uint)bVar15 * auVar62._4_4_ | (uint)!bVar15 * auVar61._4_4_;
                          auVar67._0_4_ = auVar61._0_4_;
                          bVar15 = (bool)(bVar21 >> 2 & 1);
                          auVar67._8_4_ =
                               (uint)bVar15 * auVar62._8_4_ | (uint)!bVar15 * auVar61._8_4_;
                          bVar15 = (bool)(bVar21 >> 3 & 1);
                          auVar67._12_4_ =
                               (uint)bVar15 * auVar62._12_4_ | (uint)!bVar15 * auVar61._12_4_;
                          bVar15 = (bool)(bVar21 >> 4 & 1);
                          auVar67._16_4_ =
                               (uint)bVar15 * auVar62._16_4_ | (uint)!bVar15 * auVar61._16_4_;
                          bVar15 = (bool)(bVar21 >> 5 & 1);
                          auVar67._20_4_ =
                               (uint)bVar15 * auVar62._20_4_ | (uint)!bVar15 * auVar61._20_4_;
                          bVar15 = (bool)(bVar21 >> 6 & 1);
                          auVar67._24_4_ =
                               (uint)bVar15 * auVar62._24_4_ | (uint)!bVar15 * auVar61._24_4_;
                          auVar67._28_4_ =
                               (uint)(bVar21 >> 7) * auVar62._28_4_ |
                               (uint)!(bool)(bVar21 >> 7) * auVar61._28_4_;
                          auVar91 = ZEXT3264(auVar67);
                        } while (uVar27 != 0);
                        lVar24 = POPCOUNT(uVar35) + 3;
                        do {
                          auVar61 = vpermi2q_avx512vl(auVar67,auVar59,auVar60);
                          *puVar30 = auVar61._0_8_;
                          auVar62 = auVar91._0_32_;
                          auVar61 = vpermd_avx2(auVar62,auVar82);
                          *(int *)(puVar30 + 1) = auVar61._0_4_;
                          auVar67 = valignd_avx512vl(auVar62,auVar62,1);
                          puVar30 = puVar30 + 2;
                          auVar91 = ZEXT3264(auVar67);
                          lVar24 = lVar24 + -1;
                        } while (lVar24 != 0);
                        auVar59 = vpermt2q_avx512vl(auVar59,auVar67,auVar60);
                        local_2618 = auVar59._0_8_;
                        auVar56 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
                        auVar91 = ZEXT1664(auVar56);
                        auVar92 = ZEXT3264(local_24a8);
                        auVar93 = ZEXT3264(local_24c8);
                        auVar94 = ZEXT3264(local_24e8);
                        auVar95 = ZEXT3264(local_2508);
                        auVar96 = ZEXT3264(local_2528);
                        in_ZMM13 = ZEXT3264(auVar82);
                      }
                    }
                  }
                }
              }
            }
            else {
              iVar22 = 6;
            }
          } while (iVar22 == 0);
        } while (iVar22 != 6);
        local_25c0 = unaff_R13;
        local_2398 = in_ZMM13._0_32_;
        local_25b8 = (ulong)((uint)local_2618 & 0xf) - 8;
        if (local_25b8 != 0) {
          local_2618 = local_2618 & 0xfffffffffffffff0;
          pSVar6 = context->scene;
          local_25b0 = 0;
          do {
            lVar24 = local_25b0 * 0x50;
            ppfVar7 = (pSVar6->vertices).items;
            pfVar8 = ppfVar7[*(uint *)(local_2618 + 0x30 + lVar24)];
            pfVar9 = ppfVar7[*(uint *)(local_2618 + 0x34 + lVar24)];
            pfVar10 = ppfVar7[*(uint *)(local_2618 + 0x38 + lVar24)];
            pfVar11 = ppfVar7[*(uint *)(local_2618 + 0x3c + lVar24)];
            auVar36 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(local_2618 + lVar24)),
                                    *(undefined1 (*) [16])
                                     (pfVar10 + *(uint *)(local_2618 + 8 + lVar24)));
            auVar56 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(local_2618 + lVar24)),
                                    *(undefined1 (*) [16])
                                     (pfVar10 + *(uint *)(local_2618 + 8 + lVar24)));
            auVar37 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(local_2618 + 4 + lVar24)),
                                    *(undefined1 (*) [16])
                                     (pfVar11 + *(uint *)(local_2618 + 0xc + lVar24)));
            auVar57 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(local_2618 + 4 + lVar24)),
                                    *(undefined1 (*) [16])
                                     (pfVar11 + *(uint *)(local_2618 + 0xc + lVar24)));
            auVar52 = vunpcklps_avx(auVar56,auVar57);
            auVar39 = vunpcklps_avx(auVar36,auVar37);
            auVar57 = vunpckhps_avx(auVar36,auVar37);
            auVar37 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(local_2618 + 0x10 + lVar24)),
                                    *(undefined1 (*) [16])
                                     (pfVar10 + *(uint *)(local_2618 + 0x18 + lVar24)));
            auVar56 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(local_2618 + 0x10 + lVar24)),
                                    *(undefined1 (*) [16])
                                     (pfVar10 + *(uint *)(local_2618 + 0x18 + lVar24)));
            auVar38 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(local_2618 + 0x14 + lVar24)),
                                    *(undefined1 (*) [16])
                                     (pfVar11 + *(uint *)(local_2618 + 0x1c + lVar24)));
            auVar36 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(local_2618 + 0x14 + lVar24)),
                                    *(undefined1 (*) [16])
                                     (pfVar11 + *(uint *)(local_2618 + 0x1c + lVar24)));
            auVar42 = vunpcklps_avx(auVar56,auVar36);
            auVar40 = vunpcklps_avx(auVar37,auVar38);
            auVar36 = vunpckhps_avx(auVar37,auVar38);
            auVar38 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(local_2618 + 0x20 + lVar24)),
                                    *(undefined1 (*) [16])
                                     (pfVar10 + *(uint *)(local_2618 + 0x28 + lVar24)));
            auVar56 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(local_2618 + 0x20 + lVar24)),
                                    *(undefined1 (*) [16])
                                     (pfVar10 + *(uint *)(local_2618 + 0x28 + lVar24)));
            auVar41 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(local_2618 + 0x24 + lVar24)),
                                    *(undefined1 (*) [16])
                                     (pfVar11 + *(uint *)(local_2618 + 0x2c + lVar24)));
            auVar37 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(local_2618 + 0x24 + lVar24)),
                                    *(undefined1 (*) [16])
                                     (pfVar11 + *(uint *)(local_2618 + 0x2c + lVar24)));
            auVar44 = vunpcklps_avx(auVar56,auVar37);
            auVar43 = vunpcklps_avx(auVar38,auVar41);
            puVar4 = (undefined8 *)(local_2618 + 0x30 + lVar24);
            local_23e8 = *puVar4;
            uStack_23e0 = puVar4[1];
            puVar4 = (undefined8 *)(local_2618 + 0x40 + lVar24);
            local_2538 = *puVar4;
            uStack_2530 = puVar4[1];
            auVar37 = vunpckhps_avx(auVar38,auVar41);
            local_2619 = 0;
            uVar74 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar45._4_4_ = uVar74;
            auVar45._0_4_ = uVar74;
            auVar45._8_4_ = uVar74;
            auVar45._12_4_ = uVar74;
            uVar74 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar46._4_4_ = uVar74;
            auVar46._0_4_ = uVar74;
            auVar46._8_4_ = uVar74;
            auVar46._12_4_ = uVar74;
            auVar38 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[2]))
            ;
            uVar74 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
            auVar79._4_4_ = uVar74;
            auVar79._0_4_ = uVar74;
            auVar79._8_4_ = uVar74;
            auVar79._12_4_ = uVar74;
            uVar74 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
            auVar80._4_4_ = uVar74;
            auVar80._0_4_ = uVar74;
            auVar80._8_4_ = uVar74;
            auVar80._12_4_ = uVar74;
            local_2458 = &local_2619;
            fVar68 = (ray->super_RayK<1>).dir.field_0.m128[2];
            auVar83._4_4_ = fVar68;
            auVar83._0_4_ = fVar68;
            auVar83._8_4_ = fVar68;
            auVar83._12_4_ = fVar68;
            auVar56 = vsubps_avx(auVar39,auVar45);
            auVar57 = vsubps_avx(auVar57,auVar46);
            auVar39 = vsubps_avx512vl(auVar52,auVar38);
            auVar40 = vsubps_avx512vl(auVar40,auVar45);
            auVar41 = vsubps_avx512vl(auVar36,auVar46);
            auVar42 = vsubps_avx512vl(auVar42,auVar38);
            auVar36 = vsubps_avx(auVar43,auVar45);
            auVar43 = vsubps_avx512vl(auVar37,auVar46);
            auVar38 = vsubps_avx512vl(auVar44,auVar38);
            auVar37 = vsubps_avx(auVar36,auVar56);
            auVar44 = vsubps_avx512vl(auVar43,auVar57);
            auVar45 = vsubps_avx512vl(auVar38,auVar39);
            auVar46 = vsubps_avx512vl(auVar56,auVar40);
            auVar47 = vsubps_avx512vl(auVar57,auVar41);
            auVar48 = vsubps_avx512vl(auVar39,auVar42);
            auVar49 = vsubps_avx512vl(auVar40,auVar36);
            auVar50 = vsubps_avx512vl(auVar41,auVar43);
            auVar51 = vsubps_avx512vl(auVar42,auVar38);
            auVar55._0_4_ = auVar36._0_4_ + auVar56._0_4_;
            auVar55._4_4_ = auVar36._4_4_ + auVar56._4_4_;
            auVar55._8_4_ = auVar36._8_4_ + auVar56._8_4_;
            auVar55._12_4_ = auVar36._12_4_ + auVar56._12_4_;
            auVar52 = vaddps_avx512vl(auVar43,auVar57);
            auVar53 = vaddps_avx512vl(auVar38,auVar39);
            auVar54 = vmulps_avx512vl(auVar52,auVar45);
            auVar54 = vfmsub231ps_avx512vl(auVar54,auVar44,auVar53);
            auVar53 = vmulps_avx512vl(auVar53,auVar37);
            auVar53 = vfmsub231ps_avx512vl(auVar53,auVar45,auVar55);
            auVar76._0_4_ = auVar44._0_4_ * auVar55._0_4_;
            auVar76._4_4_ = auVar44._4_4_ * auVar55._4_4_;
            auVar76._8_4_ = auVar44._8_4_ * auVar55._8_4_;
            auVar76._12_4_ = auVar44._12_4_ * auVar55._12_4_;
            auVar52 = vfmsub231ps_fma(auVar76,auVar37,auVar52);
            auVar77._0_4_ = fVar68 * auVar52._0_4_;
            auVar77._4_4_ = fVar68 * auVar52._4_4_;
            auVar77._8_4_ = fVar68 * auVar52._8_4_;
            auVar77._12_4_ = fVar68 * auVar52._12_4_;
            auVar52 = vfmadd231ps_avx512vl(auVar77,auVar80,auVar53);
            local_2488 = vfmadd231ps_avx512vl(auVar52,auVar79,auVar54);
            auVar52 = vaddps_avx512vl(auVar56,auVar40);
            auVar53 = vaddps_avx512vl(auVar57,auVar41);
            auVar54 = vaddps_avx512vl(auVar39,auVar42);
            auVar55 = vmulps_avx512vl(auVar53,auVar48);
            auVar55 = vfmsub231ps_avx512vl(auVar55,auVar47,auVar54);
            auVar54 = vmulps_avx512vl(auVar54,auVar46);
            auVar54 = vfmsub231ps_avx512vl(auVar54,auVar48,auVar52);
            auVar52 = vmulps_avx512vl(auVar52,auVar47);
            auVar52 = vfmsub231ps_avx512vl(auVar52,auVar46,auVar53);
            auVar86._0_4_ = fVar68 * auVar52._0_4_;
            auVar86._4_4_ = fVar68 * auVar52._4_4_;
            auVar86._8_4_ = fVar68 * auVar52._8_4_;
            auVar86._12_4_ = fVar68 * auVar52._12_4_;
            auVar52 = vfmadd231ps_avx512vl(auVar86,auVar80,auVar54);
            local_2478 = vfmadd231ps_avx512vl(auVar52,auVar79,auVar55);
            auVar52 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar71 = ZEXT1664(auVar52);
            auVar36 = vaddps_avx512vl(auVar40,auVar36);
            auVar40 = vaddps_avx512vl(auVar41,auVar43);
            auVar38 = vaddps_avx512vl(auVar42,auVar38);
            auVar42 = vmulps_avx512vl(auVar40,auVar51);
            auVar42 = vfmsub231ps_avx512vl(auVar42,auVar50,auVar38);
            auVar38 = vmulps_avx512vl(auVar38,auVar49);
            auVar38 = vfmsub231ps_avx512vl(auVar38,auVar51,auVar36);
            auVar54._0_4_ = auVar36._0_4_ * auVar50._0_4_;
            auVar54._4_4_ = auVar36._4_4_ * auVar50._4_4_;
            auVar54._8_4_ = auVar36._8_4_ * auVar50._8_4_;
            auVar54._12_4_ = auVar36._12_4_ * auVar50._12_4_;
            auVar36 = vfmsub231ps_avx512vl(auVar54,auVar49,auVar40);
            auVar36 = vmulps_avx512vl(auVar83,auVar36);
            auVar36 = vfmadd231ps_avx512vl(auVar36,auVar80,auVar38);
            auVar36 = vfmadd231ps_avx512vl(auVar36,auVar79,auVar42);
            auVar90._0_4_ = local_2478._0_4_ + local_2488._0_4_;
            auVar90._4_4_ = local_2478._4_4_ + local_2488._4_4_;
            auVar90._8_4_ = local_2478._8_4_ + local_2488._8_4_;
            auVar90._12_4_ = local_2478._12_4_ + local_2488._12_4_;
            local_2468 = vaddps_avx512vl(auVar36,auVar90);
            auVar43._8_4_ = 0x7fffffff;
            auVar43._0_8_ = 0x7fffffff7fffffff;
            auVar43._12_4_ = 0x7fffffff;
            auVar38 = vandps_avx512vl(local_2468,auVar43);
            auVar53._8_4_ = 0x34000000;
            auVar53._0_8_ = 0x3400000034000000;
            auVar53._12_4_ = 0x34000000;
            auVar42 = vmulps_avx512vl(auVar38,auVar53);
            auVar40 = vminps_avx512vl(local_2488,local_2478);
            auVar40 = vminps_avx512vl(auVar40,auVar36);
            auVar41 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar41 = vxorps_avx512vl(auVar42,auVar41);
            uVar17 = vcmpps_avx512vl(auVar40,auVar41,5);
            auVar40 = vmaxps_avx512vl(local_2488,local_2478);
            auVar36 = vmaxps_avx512vl(auVar40,auVar36);
            uVar18 = vcmpps_avx512vl(auVar36,auVar42,2);
            local_2450 = ((byte)uVar17 | (byte)uVar18) & 0xf;
            if (local_2450 != 0) {
              auVar36 = vmulps_avx512vl(auVar45,auVar47);
              auVar42 = vmulps_avx512vl(auVar37,auVar48);
              auVar40 = vmulps_avx512vl(auVar44,auVar46);
              auVar41 = vmulps_avx512vl(auVar48,auVar50);
              auVar43 = vmulps_avx512vl(auVar46,auVar51);
              auVar53 = vmulps_avx512vl(auVar47,auVar49);
              auVar44 = vfmsub213ps_avx512vl(auVar44,auVar48,auVar36);
              auVar45 = vfmsub213ps_avx512vl(auVar45,auVar46,auVar42);
              auVar37 = vfmsub213ps_avx512vl(auVar37,auVar47,auVar40);
              auVar47 = vfmsub213ps_avx512vl(auVar51,auVar47,auVar41);
              auVar48 = vfmsub213ps_avx512vl(auVar49,auVar48,auVar43);
              auVar46 = vfmsub213ps_avx512vl(auVar50,auVar46,auVar53);
              auVar49 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar36 = vandps_avx512vl(auVar36,auVar49);
              auVar41 = vandps_avx512vl(auVar41,auVar49);
              uVar28 = vcmpps_avx512vl(auVar36,auVar41,1);
              auVar36 = vandps_avx512vl(auVar42,auVar49);
              auVar42 = vandps_avx512vl(auVar43,auVar49);
              uVar25 = vcmpps_avx512vl(auVar36,auVar42,1);
              auVar36 = vandps_avx512vl(auVar40,auVar49);
              auVar42 = vandps_avx512vl(auVar53,auVar49);
              uVar29 = vcmpps_avx512vl(auVar36,auVar42,1);
              bVar15 = (bool)((byte)uVar28 & 1);
              local_2418._0_4_ = (uint)bVar15 * auVar44._0_4_ | (uint)!bVar15 * auVar47._0_4_;
              bVar15 = (bool)((byte)(uVar28 >> 1) & 1);
              local_2418._4_4_ = (uint)bVar15 * auVar44._4_4_ | (uint)!bVar15 * auVar47._4_4_;
              bVar15 = (bool)((byte)(uVar28 >> 2) & 1);
              local_2418._8_4_ = (uint)bVar15 * auVar44._8_4_ | (uint)!bVar15 * auVar47._8_4_;
              bVar15 = (bool)((byte)(uVar28 >> 3) & 1);
              local_2418._12_4_ = (uint)bVar15 * auVar44._12_4_ | (uint)!bVar15 * auVar47._12_4_;
              bVar15 = (bool)((byte)uVar25 & 1);
              local_2408._0_4_ = (uint)bVar15 * auVar45._0_4_ | (uint)!bVar15 * auVar48._0_4_;
              bVar15 = (bool)((byte)(uVar25 >> 1) & 1);
              local_2408._4_4_ = (uint)bVar15 * auVar45._4_4_ | (uint)!bVar15 * auVar48._4_4_;
              bVar15 = (bool)((byte)(uVar25 >> 2) & 1);
              local_2408._8_4_ = (uint)bVar15 * auVar45._8_4_ | (uint)!bVar15 * auVar48._8_4_;
              bVar15 = (bool)((byte)(uVar25 >> 3) & 1);
              local_2408._12_4_ = (uint)bVar15 * auVar45._12_4_ | (uint)!bVar15 * auVar48._12_4_;
              bVar15 = (bool)((byte)uVar29 & 1);
              local_23f8[0] = (float)((uint)bVar15 * auVar37._0_4_ | (uint)!bVar15 * auVar46._0_4_);
              bVar15 = (bool)((byte)(uVar29 >> 1) & 1);
              local_23f8[1] = (float)((uint)bVar15 * auVar37._4_4_ | (uint)!bVar15 * auVar46._4_4_);
              bVar15 = (bool)((byte)(uVar29 >> 2) & 1);
              local_23f8[2] = (float)((uint)bVar15 * auVar37._8_4_ | (uint)!bVar15 * auVar46._8_4_);
              bVar15 = (bool)((byte)(uVar29 >> 3) & 1);
              local_23f8[3] =
                   (float)((uint)bVar15 * auVar37._12_4_ | (uint)!bVar15 * auVar46._12_4_);
              auVar84._0_4_ = fVar68 * local_23f8[0];
              auVar84._4_4_ = fVar68 * local_23f8[1];
              auVar84._8_4_ = fVar68 * local_23f8[2];
              auVar84._12_4_ = fVar68 * local_23f8[3];
              auVar36 = vfmadd213ps_fma(auVar80,local_2408,auVar84);
              auVar36 = vfmadd213ps_fma(auVar79,local_2418,auVar36);
              auVar51._0_4_ = auVar36._0_4_ + auVar36._0_4_;
              auVar51._4_4_ = auVar36._4_4_ + auVar36._4_4_;
              auVar51._8_4_ = auVar36._8_4_ + auVar36._8_4_;
              auVar51._12_4_ = auVar36._12_4_ + auVar36._12_4_;
              auVar81._0_4_ = auVar39._0_4_ * local_23f8[0];
              auVar81._4_4_ = auVar39._4_4_ * local_23f8[1];
              auVar81._8_4_ = auVar39._8_4_ * local_23f8[2];
              auVar81._12_4_ = auVar39._12_4_ * local_23f8[3];
              auVar57 = vfmadd213ps_fma(auVar57,local_2408,auVar81);
              auVar57 = vfmadd213ps_fma(auVar56,local_2418,auVar57);
              auVar56 = vrcp14ps_avx512vl(auVar51);
              auVar47._8_4_ = 0x3f800000;
              auVar47._0_8_ = &DAT_3f8000003f800000;
              auVar47._12_4_ = 0x3f800000;
              auVar36 = vfnmadd213ps_avx512vl(auVar56,auVar51,auVar47);
              auVar56 = vfmadd132ps_fma(auVar36,auVar56,auVar56);
              local_2428._0_4_ = (auVar57._0_4_ + auVar57._0_4_) * auVar56._0_4_;
              local_2428._4_4_ = (auVar57._4_4_ + auVar57._4_4_) * auVar56._4_4_;
              local_2428._8_4_ = (auVar57._8_4_ + auVar57._8_4_) * auVar56._8_4_;
              local_2428._12_4_ = (auVar57._12_4_ + auVar57._12_4_) * auVar56._12_4_;
              auVar85 = ZEXT1664(local_2428);
              uVar74 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
              auVar48._4_4_ = uVar74;
              auVar48._0_4_ = uVar74;
              auVar48._8_4_ = uVar74;
              auVar48._12_4_ = uVar74;
              uVar17 = vcmpps_avx512vl(local_2428,auVar48,0xd);
              uVar28 = CONCAT44(auVar51._4_4_,auVar51._0_4_);
              auVar50._0_8_ = uVar28 ^ 0x8000000080000000;
              auVar50._8_4_ = -auVar51._8_4_;
              auVar50._12_4_ = -auVar51._12_4_;
              fVar68 = (ray->super_RayK<1>).tfar;
              auVar49._4_4_ = fVar68;
              auVar49._0_4_ = fVar68;
              auVar49._8_4_ = fVar68;
              auVar49._12_4_ = fVar68;
              uVar18 = vcmpps_avx512vl(local_2428,auVar49,2);
              uVar16 = vcmpps_avx512vl(auVar51,auVar50,4);
              local_2450 = (byte)uVar17 & (byte)uVar18 & (byte)uVar16 & local_2450;
              uVar34 = (uint)local_2450;
              if (local_2450 != 0) {
                uVar28 = vcmpps_avx512vl(auVar38,auVar91._0_16_,5);
                auVar57 = vrcp14ps_avx512vl(local_2468);
                auVar72._8_4_ = 0x3f800000;
                auVar72._0_8_ = &DAT_3f8000003f800000;
                auVar72._12_4_ = 0x3f800000;
                auVar56 = vfnmadd213ps_fma(local_2468,auVar57,auVar72);
                auVar56 = vfmadd132ps_avx512vl(auVar56,auVar57,auVar57);
                fVar1 = (float)((uint)((byte)uVar28 & 1) * auVar56._0_4_);
                fVar68 = (float)((uint)((byte)(uVar28 >> 1) & 1) * auVar56._4_4_);
                fVar2 = (float)((uint)((byte)(uVar28 >> 2) & 1) * auVar56._8_4_);
                fVar3 = (float)((uint)((byte)(uVar28 >> 3) & 1) * auVar56._12_4_);
                auVar69._0_4_ = fVar1 * local_2488._0_4_;
                auVar69._4_4_ = fVar68 * local_2488._4_4_;
                auVar69._8_4_ = fVar2 * local_2488._8_4_;
                auVar69._12_4_ = fVar3 * local_2488._12_4_;
                local_2448 = vminps_avx(auVar69,auVar72);
                auVar70._0_4_ = fVar1 * local_2478._0_4_;
                auVar70._4_4_ = fVar68 * local_2478._4_4_;
                auVar70._8_4_ = fVar2 * local_2478._8_4_;
                auVar70._12_4_ = fVar3 * local_2478._12_4_;
                local_2438 = vminps_avx(auVar70,auVar72);
                auVar56 = vblendmps_avx512vl(auVar52,local_2428);
                auVar58._0_4_ =
                     (uint)(local_2450 & 1) * auVar56._0_4_ |
                     (uint)!(bool)(local_2450 & 1) * local_2438._0_4_;
                bVar15 = (bool)(local_2450 >> 1 & 1);
                auVar58._4_4_ = (uint)bVar15 * auVar56._4_4_ | (uint)!bVar15 * local_2438._4_4_;
                bVar15 = (bool)(local_2450 >> 2 & 1);
                auVar58._8_4_ = (uint)bVar15 * auVar56._8_4_ | (uint)!bVar15 * local_2438._8_4_;
                auVar58._12_4_ =
                     (uint)(local_2450 >> 3) * auVar56._12_4_ |
                     (uint)!(bool)(local_2450 >> 3) * local_2438._12_4_;
                auVar56 = vshufps_avx(auVar58,auVar58,0xb1);
                auVar56 = vminps_avx(auVar56,auVar58);
                auVar57 = vshufpd_avx(auVar56,auVar56,1);
                auVar56 = vminps_avx(auVar57,auVar56);
                uVar17 = vcmpps_avx512vl(auVar58,auVar56,0);
                bVar21 = (byte)uVar17 & local_2450;
                if (((byte)uVar17 & local_2450) == 0) {
                  bVar21 = local_2450;
                }
                uVar28 = 0;
                for (uVar25 = (ulong)bVar21; (uVar25 & 1) == 0;
                    uVar25 = uVar25 >> 1 | 0x8000000000000000) {
                  uVar28 = uVar28 + 1;
                }
                do {
                  uVar26 = *(uint *)((long)&local_23e8 + uVar28 * 4);
                  pGVar12 = (pSVar6->geometries).items[uVar26].ptr;
                  auVar56 = auVar58;
                  if ((pGVar12->mask & (ray->super_RayK<1>).mask) == 0) {
                    bVar21 = ~(byte)(1 << ((uint)uVar28 & 0x1f)) & (byte)uVar34;
LAB_01fcfa64:
                    uVar34 = (uint)bVar21;
                    bVar15 = true;
                  }
                  else {
                    pRVar13 = context->args;
                    if ((pRVar13->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar12->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_25a8.context = context->user;
                      local_2578 = *(float *)(local_2418 + uVar28 * 4);
                      local_2574 = local_23f8[uVar28 - 4];
                      local_2570 = local_23f8[uVar28];
                      local_256c = *(undefined4 *)(local_2448 + uVar28 * 4);
                      local_2568 = *(undefined4 *)(local_2438 + uVar28 * 4);
                      local_2564 = *(undefined4 *)((long)&local_2538 + uVar28 * 4);
                      local_2560 = uVar26;
                      local_255c = (local_25a8.context)->instID[0];
                      local_2558 = (local_25a8.context)->instPrimID[0];
                      local_25f8 = (ray->super_RayK<1>).tfar;
                      (ray->super_RayK<1>).tfar = *(float *)(local_2428 + uVar28 * 4);
                      local_25f4 = -1;
                      local_25a8.valid = &local_25f4;
                      local_25a8.geometryUserPtr = pGVar12->userPtr;
                      local_25a8.ray = (RTCRayN *)ray;
                      local_25a8.hit = (RTCHitN *)&local_2578;
                      local_25a8.N = 1;
                      local_2548 = auVar85._0_16_;
                      if (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01fcfc43:
                        if (pRVar13->filter != (RTCFilterFunctionN)0x0) {
                          if (((pRVar13->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar12->field_8).field_0x2 & 0x40) != 0)) {
                            (*pRVar13->filter)(&local_25a8);
                            auVar85 = ZEXT1664(local_2548);
                            auVar56 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                            auVar71 = ZEXT1664(auVar56);
                            auVar96 = ZEXT3264(local_2528);
                            auVar95 = ZEXT3264(local_2508);
                            auVar94 = ZEXT3264(local_24e8);
                            auVar93 = ZEXT3264(local_24c8);
                            auVar92 = ZEXT3264(local_24a8);
                            auVar56 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
                            auVar91 = ZEXT1664(auVar56);
                            ray = local_2608;
                            context = local_2600;
                            uVar31 = local_2610;
                          }
                          if (*local_25a8.valid == 0) goto LAB_01fcfd31;
                        }
                        (((Vec3f *)((long)local_25a8.ray + 0x30))->field_0).field_0.x =
                             *(float *)local_25a8.hit;
                        (((Vec3f *)((long)local_25a8.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_25a8.hit + 4);
                        (((Vec3f *)((long)local_25a8.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_25a8.hit + 8);
                        *(float *)((long)local_25a8.ray + 0x3c) = *(float *)(local_25a8.hit + 0xc);
                        local_25f8 = *(float *)(local_25a8.hit + 0x10);
                        *(float *)((long)local_25a8.ray + 0x40) = local_25f8;
                        *(float *)((long)local_25a8.ray + 0x44) = *(float *)(local_25a8.hit + 0x14);
                        *(float *)((long)local_25a8.ray + 0x48) = *(float *)(local_25a8.hit + 0x18);
                        *(float *)((long)local_25a8.ray + 0x4c) = *(float *)(local_25a8.hit + 0x1c);
                        *(float *)((long)local_25a8.ray + 0x50) = *(float *)(local_25a8.hit + 0x20);
                      }
                      else {
                        local_25f0 = puVar30;
                        (*pGVar12->intersectionFilterN)(&local_25a8);
                        auVar85 = ZEXT1664(local_2548);
                        auVar56 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                        auVar71 = ZEXT1664(auVar56);
                        auVar96 = ZEXT3264(local_2528);
                        auVar95 = ZEXT3264(local_2508);
                        auVar94 = ZEXT3264(local_24e8);
                        auVar93 = ZEXT3264(local_24c8);
                        auVar92 = ZEXT3264(local_24a8);
                        auVar56 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
                        auVar91 = ZEXT1664(auVar56);
                        ray = local_2608;
                        context = local_2600;
                        puVar30 = local_25f0;
                        uVar31 = local_2610;
                        if (*local_25a8.valid != 0) goto LAB_01fcfc43;
LAB_01fcfd31:
                        (ray->super_RayK<1>).tfar = local_25f8;
                      }
                      fVar68 = (ray->super_RayK<1>).tfar;
                      auVar20._4_4_ = fVar68;
                      auVar20._0_4_ = fVar68;
                      auVar20._8_4_ = fVar68;
                      auVar20._12_4_ = fVar68;
                      uVar17 = vcmpps_avx512vl(auVar85._0_16_,auVar20,2);
                      bVar21 = ~(byte)(1 << ((uint)uVar28 & 0x1f)) & (byte)uVar34 & (byte)uVar17;
                      auVar56 = ZEXT416((uint)local_25f8);
                      goto LAB_01fcfa64;
                    }
                    bVar15 = false;
                  }
                  if (!bVar15) {
                    fVar68 = *(float *)(local_2448 + uVar28 * 4);
                    fVar2 = *(float *)(local_2438 + uVar28 * 4);
                    (ray->super_RayK<1>).tfar = *(float *)(local_2428 + uVar28 * 4);
                    (ray->Ng).field_0.field_0.x = *(float *)(local_2418 + uVar28 * 4);
                    (ray->Ng).field_0.field_0.y = local_23f8[uVar28 - 4];
                    (ray->Ng).field_0.field_0.z = local_23f8[uVar28];
                    ray->u = fVar68;
                    ray->v = fVar2;
                    ray->primID = *(uint *)((long)&local_2538 + uVar28 * 4);
                    ray->geomID = uVar26;
                    pRVar14 = context->user;
                    ray->instID[0] = pRVar14->instID[0];
                    ray->instPrimID[0] = pRVar14->instPrimID[0];
                    break;
                  }
                  bVar21 = (byte)uVar34;
                  if (bVar21 == 0) break;
                  auVar57 = vblendmps_avx512vl(auVar71._0_16_,auVar85._0_16_);
                  auVar58._0_4_ =
                       (uint)(bVar21 & 1) * auVar57._0_4_ |
                       (uint)!(bool)(bVar21 & 1) * auVar56._0_4_;
                  bVar15 = (bool)((byte)(uVar34 >> 1) & 1);
                  auVar58._4_4_ = (uint)bVar15 * auVar57._4_4_ | (uint)!bVar15 * auVar56._4_4_;
                  bVar15 = (bool)((byte)(uVar34 >> 2) & 1);
                  auVar58._8_4_ = (uint)bVar15 * auVar57._8_4_ | (uint)!bVar15 * auVar56._8_4_;
                  auVar58._12_4_ =
                       (uVar34 >> 3) * auVar57._12_4_ | (uint)!SUB41(uVar34 >> 3,0) * auVar56._12_4_
                  ;
                  auVar56 = vshufps_avx(auVar58,auVar58,0xb1);
                  auVar56 = vminps_avx(auVar56,auVar58);
                  auVar57 = vshufpd_avx(auVar56,auVar56,1);
                  auVar56 = vminps_avx(auVar57,auVar56);
                  uVar17 = vcmpps_avx512vl(auVar58,auVar56,0);
                  bVar21 = (byte)uVar17 & bVar21;
                  uVar26 = uVar34;
                  if (bVar21 != 0) {
                    uVar26 = (uint)bVar21;
                  }
                  uVar19 = 0;
                  for (; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x80000000) {
                    uVar19 = uVar19 + 1;
                  }
                  uVar28 = (ulong)uVar19;
                } while( true );
              }
            }
            local_25b0 = local_25b0 + 1;
          } while (local_25b0 != local_25b8);
        }
        fVar68 = (ray->super_RayK<1>).tfar;
        auVar71 = ZEXT3264(CONCAT428(fVar68,CONCAT424(fVar68,CONCAT420(fVar68,CONCAT416(fVar68,
                                                  CONCAT412(fVar68,CONCAT48(fVar68,CONCAT44(fVar68,
                                                  fVar68))))))));
        auVar85 = ZEXT3264(local_23b8);
        auVar87 = ZEXT3264(local_23d8);
        auVar59 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
        auVar88 = ZEXT3264(auVar59);
        auVar89 = ZEXT3264(CONCAT428(0xfffffff8,
                                     CONCAT424(0xfffffff8,
                                               CONCAT420(0xfffffff8,
                                                         CONCAT416(0xfffffff8,
                                                                   CONCAT412(0xfffffff8,
                                                                             CONCAT48(0xfffffff8,
                                                                                                                                                                            
                                                  0xfffffff8fffffff8)))))));
        in_ZMM13 = ZEXT3264(local_2398);
        uVar28 = local_25d8;
        uVar25 = local_25c8;
        uVar29 = local_25d0;
        unaff_R13 = local_25c0;
        uVar32 = local_25e0;
        uVar33 = local_25e8;
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }